

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void Oprops_on(obj *otmp,uint mask)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  boolean old;
  long props;
  uint mask_local;
  obj *otmp_local;
  
  uVar1 = otmp->oprops;
  if ((uVar1 & 1) != 0) {
    u.uprops[1].extrinsic = mask | u.uprops[1].extrinsic;
  }
  if ((uVar1 & 2) != 0) {
    u.uprops[2].extrinsic = mask | u.uprops[2].extrinsic;
  }
  if ((uVar1 & 4) != 0) {
    u.uprops[0x35].extrinsic = mask | u.uprops[0x35].extrinsic;
  }
  if ((uVar1 & 0x20) != 0) {
    bVar4 = u.uprops[0x1a].extrinsic == 0;
    u.uprops[0x1a].extrinsic = mask | u.uprops[0x1a].extrinsic;
    if (((u.uprops[0x1a].intrinsic & 0xffffff) == 0) && (bVar4)) {
      otmp->oprops_known = otmp->oprops_known | 0x20;
      pcVar3 = "";
      if (!bVar4 || u.uprops[0x1a].intrinsic != 0) {
        pcVar3 = " a bit more";
      }
      pline("You feel yourself speed up%s.",pcVar3);
    }
  }
  if ((uVar1 & 0x10) != 0) {
    u.uprops[0x2a].extrinsic = mask | u.uprops[0x2a].extrinsic;
  }
  if ((uVar1 & 0x40) != 0) {
    pcVar3 = Tobjnam(otmp,"fit");
    pline("%s very tightly.",pcVar3);
    otmp->oprops_known = otmp->oprops_known | 0x40;
  }
  if ((uVar1 & 0x80) != 0) {
    otmp->oprops_known = otmp->oprops_known | 0x80;
  }
  if ((uVar1 & 0x300) != 0) {
    adj_abon(otmp,otmp->spe);
  }
  if ((uVar1 & 0x400) != 0) {
    u.uprops[0x19].extrinsic = mask | u.uprops[0x19].extrinsic;
    see_monsters();
  }
  if ((uVar1 & 0x800) != 0) {
    u.uprops[0x2d].extrinsic = mask | u.uprops[0x2d].extrinsic;
    otmp->oprops_known = otmp->oprops_known | 0x800;
  }
  if ((uVar1 & 0x1000) != 0) {
    u.uprops[0xb].extrinsic = mask | u.uprops[0xb].extrinsic;
  }
  if ((uVar1 & 0x2000) != 0) {
    u.uprops[0x18].extrinsic = mask | u.uprops[0x18].extrinsic;
    see_monsters();
  }
  if ((uVar1 & 0x4000) != 0) {
    if (((u.uprops[0x13].extrinsic == 0) && (u.uprops[0x13].intrinsic == 0)) &&
       (u.uprops[0x13].blocked == 0)) {
      pline("You move very quietly.");
      otmp->oprops_known = otmp->oprops_known | 0x4000;
    }
    u.uprops[0x13].extrinsic = mask | u.uprops[0x13].extrinsic;
  }
  if ((uVar1 & 0x8000) != 0) {
    if ((u.uprops[0x25].extrinsic == 0) && ((u.uprops[0x25].intrinsic & 0xff000000) == 0)) {
      iVar2 = rnd(0x14);
      incr_itimeout(&u.uprops[0x25].intrinsic,(long)iVar2);
    }
    u.uprops[0x25].extrinsic = mask | u.uprops[0x25].extrinsic;
  }
  if ((uVar1 & 0x10000) != 0) {
    u.uprops[0x2e].extrinsic = mask | u.uprops[0x2e].extrinsic;
  }
  if ((uVar1 & 0x40000) != 0) {
    u.uprops[0x28].extrinsic = mask | u.uprops[0x28].extrinsic;
  }
  if ((uVar1 & 0x80000) != 0) {
    u.uprops[0x14].extrinsic = mask | u.uprops[0x14].extrinsic;
  }
  return;
}

Assistant:

static void Oprops_on(struct obj *otmp, unsigned int mask)
{
	long props = otmp->oprops;

	if (props & ITEM_FIRE)
	    EFire_resistance |= mask;

	if (props & ITEM_FROST)
	    ECold_resistance |= mask;

	if (props & ITEM_DRLI)
	    EDrain_resistance |= mask;

	if (props & ITEM_SPEED) {
	    boolean old = !!EFast;
	    EFast |= mask;
	    if (!(HFast & TIMEOUT) && !old) {
		otmp->oprops_known |= ITEM_SPEED;
		pline("You feel yourself speed up%s.",
		      (old || HFast) ? " a bit more" : "");
	    }
	}

	if (props & ITEM_REFLECTION)
	    EReflecting |= mask;

	if (props & ITEM_OILSKIN) {
	    pline("%s very tightly.", Tobjnam(otmp, "fit"));
	    otmp->oprops_known |= ITEM_OILSKIN;
	}

	if (props & ITEM_POWER)
	    otmp->oprops_known |= ITEM_POWER;

	if (props & (ITEM_DEXTERITY|ITEM_BRILLIANCE))
	    adj_abon(otmp, otmp->spe);

	if (props & ITEM_ESP) {
	    ETelepat |= mask;
	    see_monsters();
	}

	if (props & ITEM_DISPLACEMENT) {
	    EDisplaced |= mask;
	    otmp->oprops_known |= ITEM_DISPLACEMENT;
	}

	if (props & ITEM_SEARCHING)
	    ESearching |= mask;

	if (props & ITEM_WARNING) {
	    EWarning |= mask;
	    see_monsters();
	}

	if (props & ITEM_STEALTH) {
	    if (!EStealth && !HStealth && !BStealth) {
		pline("You move very quietly.");
		otmp->oprops_known |= ITEM_STEALTH;
	    }
	    EStealth |= mask;
	}

	if (props & ITEM_FUMBLING) {
	    if (!EFumbling && !(HFumbling & ~TIMEOUT))
		incr_itimeout(&HFumbling, rnd(20));
	    EFumbling |= mask;
	}

	if (props & ITEM_CLAIRVOYANCE)
	    EClairvoyant |= mask;

	if (props & ITEM_HUNGER)
	    EHunger |= mask;

	if (props & ITEM_AGGRAVATE)
	    EAggravate_monster |= mask;
}